

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O1

string * nlohmann::
         basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
         ::lexer::token_type_name(string *__return_storage_ptr__,token_type t)

{
  char *pcVar1;
  char *pcVar2;
  
  switch(t) {
  case uninitialized:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "<uninitialized>";
    pcVar1 = "";
    break;
  case literal_true:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "true literal";
    pcVar1 = "";
    break;
  case literal_false:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "false literal";
    pcVar1 = "";
    break;
  case literal_null:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "null literal";
    pcVar1 = "";
    break;
  case value_string:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "string literal";
    pcVar1 = "";
    break;
  case value_unsigned:
  case value_integer:
  case value_float:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "number literal";
    pcVar1 = "";
    break;
  case begin_array:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "\'[\'";
    pcVar1 = "";
    break;
  case begin_object:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "\'{\'";
    pcVar1 = "";
    break;
  case end_array:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "\']\'";
    pcVar1 = "";
    break;
  case end_object:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "\'}\'";
    pcVar1 = "";
    break;
  case name_separator:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "\':\'";
    pcVar1 = "";
    break;
  case value_separator:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "\',\'";
    pcVar1 = "";
    break;
  case parse_error:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "<parse error>";
    pcVar1 = "";
    break;
  case end_of_input:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "end of input";
    pcVar1 = "";
    break;
  default:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "unknown token";
    pcVar1 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar2,pcVar1);
  return __return_storage_ptr__;
}

Assistant:

static std::string token_type_name(const token_type t)
			{
				switch (t)
				{
				case token_type::uninitialized:
					return "<uninitialized>";
				case token_type::literal_true:
					return "true literal";
				case token_type::literal_false:
					return "false literal";
				case token_type::literal_null:
					return "null literal";
				case token_type::value_string:
					return "string literal";
				case lexer::token_type::value_unsigned:
				case lexer::token_type::value_integer:
				case lexer::token_type::value_float:
					return "number literal";
				case token_type::begin_array:
					return "'['";
				case token_type::begin_object:
					return "'{'";
				case token_type::end_array:
					return "']'";
				case token_type::end_object:
					return "'}'";
				case token_type::name_separator:
					return "':'";
				case token_type::value_separator:
					return "','";
				case token_type::parse_error:
					return "<parse error>";
				case token_type::end_of_input:
					return "end of input";
				default:
				{
					// catch non-enum values
					return "unknown token"; // LCOV_EXCL_LINE
				}
				}
			}